

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

int Gia_ManMultiProve(Gia_Man_t *p,Bmc_MulPar_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pAig;
  Bmc_MulPar_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vSeqModelVec);
    p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  }
  p_00 = Gia_ManToAig(p,0);
  pVVar4 = Gia_ManMultiProveAig(p_00,pPars);
  p->vSeqModelVec = pVVar4;
  iVar1 = Vec_PtrSize(p->vSeqModelVec);
  iVar2 = Gia_ManPoNum(p);
  if (iVar1 == iVar2) {
    iVar1 = Vec_PtrCountZero(p->vSeqModelVec);
    iVar2 = Vec_PtrSize(p->vSeqModelVec);
    iVar3 = 0;
    if (iVar1 == iVar2) {
      iVar3 = -1;
    }
    return iVar3;
  }
  __assert_fail("Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                ,0x11e,"int Gia_ManMultiProve(Gia_Man_t *, Bmc_MulPar_t *)");
}

Assistant:

int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars )
{
    Aig_Man_t * pAig;
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec ), p->vSeqModelVec = NULL;
    pAig = Gia_ManToAig( p, 0 );
    p->vSeqModelVec = Gia_ManMultiProveAig( pAig, pPars ); // deletes pAig
    assert( Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p) );
    return Vec_PtrCountZero(p->vSeqModelVec) == Vec_PtrSize(p->vSeqModelVec) ? -1 : 0;
}